

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManDemiterTwoWords(Gia_Man_t *p,Gia_Man_t **pp0,Gia_Man_t **pp1)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t **ppGVar5;
  int iVar6;
  uint fSecond;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x121c,"int Gia_ManDemiterTwoWords(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  if ((p->vCos->nSize & 1) != 0) {
    __assert_fail("Gia_ManCoNum(p) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x121d,"int Gia_ManDemiterTwoWords(Gia_Man_t *, Gia_Man_t **, Gia_Man_t **)");
  }
  *pp1 = (Gia_Man_t *)0x0;
  *pp0 = (Gia_Man_t *)0x0;
  fSecond = 0;
  do {
    if (fSecond == 2) {
      return 1;
    }
    p_00 = Gia_ManCollectReach2(p,fSecond);
    p_01 = Gia_ManStart(p->vCos->nSize / 2 + p->vCis->nSize + p_00->nSize + 1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_01->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_01->pSpec = pcVar3;
    p->pObjs->Value = 0;
    for (iVar6 = 0; iVar6 < p->vCis->nSize - p->nRegs; iVar6 = iVar6 + 1) {
      pGVar4 = Gia_ManCi(p,iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ManAppendCi(p_01);
      pGVar4->Value = uVar1;
    }
    for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar6);
      pGVar4 = Gia_ManObj(p,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_01,iVar2,iLit1);
      pGVar4->Value = uVar1;
    }
    for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
      pGVar4 = Gia_ManCo(p,iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (fSecond != iVar6 < p->vCos->nSize / 2) {
        iVar2 = Gia_ObjFanin0Copy(pGVar4);
        Gia_ManAppendCo(p_01,iVar2);
      }
    }
    Vec_IntFree(p_00);
    ppGVar5 = pp1;
    if (fSecond == 0) {
      ppGVar5 = pp0;
    }
    *ppGVar5 = p_01;
    fSecond = fSecond + 1;
  } while( true );
}

Assistant:

int Gia_ManDemiterTwoWords( Gia_Man_t * p, Gia_Man_t ** pp0, Gia_Man_t ** pp1 )
{
    Gia_Obj_t * pObj;
    int i, fSecond;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) % 2 == 0 );
    *pp0 = *pp1 = NULL;
    for ( fSecond = 0; fSecond < 2; fSecond++ )
    {
        Vec_Int_t * vNodes = Gia_ManCollectReach2( p, fSecond );
        Gia_Man_t * pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Gia_ManCoNum(p)/2 );
        pNew->pName = Abc_UtilStrsav( p->pName );
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
        Gia_ManConst0(p)->Value = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachObjVec( vNodes, p, pObj, i )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            if ( (i < Gia_ManCoNum(p)/2) ^ fSecond )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Vec_IntFree( vNodes );
        if ( fSecond )
            *pp1 = pNew;
        else
            *pp0 = pNew;
    }
    return 1;
}